

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::AssertionResult::getMessage_abi_cxx11_(string *__return_storage_ptr__,AssertionResult *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,&(this->m_resultData).message);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getMessage() const {
        return m_resultData.message;
    }